

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceParameters::verifySize
               (int NPL,int NX)

{
  char *in_RAX;
  undefined8 *puVar1;
  
  if (NPL < 1) {
    tools::Log::error<char_const*>(in_RAX);
  }
  else {
    if ((uint)NPL % 6 == 0) {
      return;
    }
    tools::Log::error<char_const*>(in_RAX);
  }
  tools::Log::info<char_const*>(in_RAX);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
  tools::Log::info<char_const*,int>("NX value: {}",NX);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NX ) {

  if ( NPL < 1 ) {

    Log::error( "Encountered empty list" );
    Log::info( "NPL should be larger than zero and equal to 6 * NX" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NX value: {}", NX );
    throw std::exception();
  }

  if ( NPL % 6 != 0 ) {

    Log::error( "Encountered inconsistent list size" );
    Log::info( "NPL must be equal to 6 * NX" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NX value: {}", NX );
    throw std::exception();
  }
}